

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O3

Result wabt::ParseUint64(char *s,char *end,uint64_t *out)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  if (s == end) {
    return (Result)Error;
  }
  pcVar2 = end;
  if (((*s == '0') && (s + 1 < end)) && (s[1] == 'x')) {
    s = s + 2;
    if (s == end) {
      return (Result)Error;
    }
    if (s < end) {
      uVar1 = 0;
      do {
        iVar3 = (int)*s;
        uVar5 = uVar1;
        if (iVar3 != 0x5f) {
          uVar4 = iVar3 - 0x30;
          if (9 < uVar4) {
            if (iVar3 - 0x61U < 7) {
              uVar4 = iVar3 - 0x57;
            }
            else {
              if (6 < iVar3 - 0x41U) {
                return (Result)Error;
              }
              uVar4 = iVar3 - 0x37;
            }
          }
          uVar5 = (ulong)uVar4 + uVar1 * 0x10;
          if (uVar5 < uVar1) {
            return (Result)Error;
          }
        }
        s = s + 1;
        uVar1 = uVar5;
      } while (s != end);
      goto LAB_00f4b098;
    }
  }
  else if (s < end) {
    uVar1 = 0;
    do {
      uVar5 = uVar1;
      if (*s != 0x5f) {
        uVar4 = (int)*s - 0x30;
        if (9 < uVar4) {
          return (Result)Error;
        }
        uVar5 = (ulong)uVar4 + uVar1 * 10;
        if (uVar5 < uVar1) {
          return (Result)Error;
        }
      }
      s = s + 1;
      uVar1 = uVar5;
    } while (s != end);
    goto LAB_00f4b098;
  }
  uVar5 = 0;
  pcVar2 = s;
LAB_00f4b098:
  if (pcVar2 == end) {
    *out = uVar5;
  }
  return (Result)(uint)(pcVar2 != end);
}

Assistant:

Result ParseUint64(const char* s, const char* end, uint64_t* out) {
  if (s == end) {
    return Result::Error;
  }
  uint64_t value = 0;
  if (*s == '0' && s + 1 < end && s[1] == 'x') {
    s += 2;
    if (s == end) {
      return Result::Error;
    }
    for (; s < end; ++s) {
      uint32_t digit;
      if (*s == '_') {
        continue;
      }
      CHECK_RESULT(ParseHexdigit(*s, &digit));
      uint64_t old_value = value;
      value = value * 16 + digit;
      // Check for overflow.
      if (old_value > value) {
        return Result::Error;
      }
    }
  } else {
    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }
      uint32_t digit = (*s - '0');
      if (digit > 9) {
        return Result::Error;
      }
      uint64_t old_value = value;
      value = value * 10 + digit;
      // Check for overflow.
      if (old_value > value) {
        return Result::Error;
      }
    }
  }
  if (s != end) {
    return Result::Error;
  }
  *out = value;
  return Result::Ok;
}